

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintString
          (string *__return_storage_ptr__,FieldValuePrinter *this,string *val)

{
  string *in_RCX;
  StringPiece src;
  StringPiece local_48 [2];
  allocator local_22;
  undefined1 local_21;
  string *local_20;
  string *val_local;
  FieldValuePrinter *this_local;
  string *printed;
  
  local_21 = 0;
  local_20 = val;
  val_local = (string *)this;
  this_local = (FieldValuePrinter *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"\"",&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  StringPiece::StringPiece<std::allocator<char>>(local_48,local_20);
  src.length_ = (stringpiece_ssize_type)__return_storage_ptr__;
  src.ptr_ = (char *)local_48[0].length_;
  CEscapeAndAppend((protobuf *)local_48[0].ptr_,src,in_RCX);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string TextFormat::FieldValuePrinter::PrintString(const string& val) const {
  string printed("\"");
  CEscapeAndAppend(val, &printed);
  printed.push_back('\"');
  return printed;
}